

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldOptions::SerializeWithCachedSizes
          (FieldOptions *this,CodedOutputStream *output)

{
  bool bVar1;
  FieldOptions_CType value;
  FieldOptions_JSType value_00;
  uint uVar2;
  UninterpretedOption *value_01;
  UnknownFieldSet *unknown_fields;
  uint local_40;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  FieldOptions *this_local;
  
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    value = ctype(this);
    internal::WireFormatLite::WriteEnum(1,value,output);
  }
  if ((uVar2 & 2) != 0) {
    bVar1 = packed(this);
    internal::WireFormatLite::WriteBool(2,bVar1,output);
  }
  if ((uVar2 & 8) != 0) {
    bVar1 = deprecated(this);
    internal::WireFormatLite::WriteBool(3,bVar1,output);
  }
  if ((uVar2 & 4) != 0) {
    bVar1 = lazy(this);
    internal::WireFormatLite::WriteBool(5,bVar1,output);
  }
  if ((uVar2 & 0x20) != 0) {
    value_00 = jstype(this);
    internal::WireFormatLite::WriteEnum(6,value_00,output);
  }
  if ((uVar2 & 0x10) != 0) {
    bVar1 = weak(this);
    internal::WireFormatLite::WriteBool(10,bVar1,output);
  }
  local_40 = 0;
  uVar2 = uninterpreted_option_size(this);
  for (; local_40 < uVar2; local_40 = local_40 + 1) {
    value_01 = uninterpreted_option(this,local_40);
    internal::WireFormatLite::WriteMessageMaybeToArray(999,(MessageLite *)value_01,output);
  }
  internal::ExtensionSet::SerializeWithCachedSizes(&this->_extensions_,1000,0x20000000,output);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = FieldOptions::unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void FieldOptions::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:google.protobuf.FieldOptions)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->ctype(), output);
  }

  // optional bool packed = 2;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(2, this->packed(), output);
  }

  // optional bool deprecated = 3 [default = false];
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(3, this->deprecated(), output);
  }

  // optional bool lazy = 5 [default = false];
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(5, this->lazy(), output);
  }

  // optional .google.protobuf.FieldOptions.JSType jstype = 6 [default = JS_NORMAL];
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      6, this->jstype(), output);
  }

  // optional bool weak = 10 [default = false];
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(10, this->weak(), output);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned int i = 0, n = this->uninterpreted_option_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      999, this->uninterpreted_option(i), output);
  }

  // Extension range [1000, 536870912)
  _extensions_.SerializeWithCachedSizes(
      1000, 536870912, output);

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:google.protobuf.FieldOptions)
}